

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

RECEIVED_HANDLE received_clone(RECEIVED_HANDLE value)

{
  RECEIVED_HANDLE __ptr;
  AMQP_VALUE pAVar1;
  
  __ptr = (RECEIVED_HANDLE)malloc(8);
  if (__ptr != (RECEIVED_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(value->composite_value);
    __ptr->composite_value = pAVar1;
    if (pAVar1 != (AMQP_VALUE)0x0) {
      return __ptr;
    }
    free(__ptr);
  }
  return (RECEIVED_HANDLE)0x0;
}

Assistant:

RECEIVED_HANDLE received_clone(RECEIVED_HANDLE value)
{
    RECEIVED_INSTANCE* received_instance = (RECEIVED_INSTANCE*)malloc(sizeof(RECEIVED_INSTANCE));
    if (received_instance != NULL)
    {
        received_instance->composite_value = amqpvalue_clone(((RECEIVED_INSTANCE*)value)->composite_value);
        if (received_instance->composite_value == NULL)
        {
            free(received_instance);
            received_instance = NULL;
        }
    }

    return received_instance;
}